

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O3

qint64 __thiscall
QCalendarBackend::matchCenturyToWeekday(QCalendarBackend *this,YearMonthDay *parts,int dow)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = parts->year;
  uVar2 = parts->month;
  uVar3 = parts->day;
  iVar4 = (uint)(iVar1 < 1) * 2 + -1;
  iVar8 = 0xf;
  iVar9 = iVar1;
  iVar10 = iVar1;
  do {
    iVar5 = (*this->_vptr_QCalendarBackend[0xc])(this);
    iVar6 = 0;
    if (iVar9 < 1 == 0 < iVar1) {
      iVar6 = iVar4;
    }
    iVar11 = 0;
    if ((char)iVar5 == '\0') {
      iVar11 = iVar6;
    }
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    iVar6 = (*this->_vptr_QCalendarBackend[6])
                      (this,(ulong)(uint)(iVar11 + iVar9),(ulong)uVar2,(ulong)uVar3);
    if ((((char)iVar6 != '\0') &&
        (iVar6 = (*this->_vptr_QCalendarBackend[0x10])
                           (this,(ulong)(uint)(iVar11 + iVar9),(ulong)uVar2,(ulong)uVar3,&local_40),
        (char)iVar6 != '\0')) &&
       (iVar6 = (*this->_vptr_QCalendarBackend[0x12])(this,local_40), puVar7 = local_40,
       iVar6 == dow)) goto LAB_00342115;
    if (iVar8 != 0xf) {
      iVar5 = (*this->_vptr_QCalendarBackend[0xc])(this);
      iVar6 = 0;
      if (iVar10 < 1 == 0 < iVar1) {
        iVar6 = iVar4;
      }
      iVar11 = 0;
      if ((char)iVar5 == '\0') {
        iVar11 = iVar6;
      }
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = (*this->_vptr_QCalendarBackend[6])
                        (this,(ulong)(uint)(iVar11 + iVar10),(ulong)uVar2,(ulong)uVar3);
      if ((((char)iVar6 != '\0') &&
          (iVar6 = (*this->_vptr_QCalendarBackend[0x10])
                             (this,(ulong)(uint)(iVar11 + iVar10),(ulong)uVar2,(ulong)uVar3,
                              &local_40), (char)iVar6 != '\0')) &&
         (iVar6 = (*this->_vptr_QCalendarBackend[0x12])(this,local_40), puVar7 = local_40,
         iVar6 == dow)) goto LAB_00342115;
    }
    iVar9 = iVar9 + 100;
    iVar10 = iVar10 + -100;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  puVar7 = (undefined1 *)0x8000000000000000;
LAB_00342115:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (qint64)puVar7;
}

Assistant:

qint64 QCalendarBackend::matchCenturyToWeekday(const QCalendar::YearMonthDay &parts, int dow) const
{
    Q_ASSERT(parts.isValid());
    // Brute-force solution as fall-back.
    const auto checkOffset = [parts, dow, this](int centuries) -> std::optional<qint64> {
        // Offset parts.year by the given number of centuries:
        int year = parts.year + centuries * 100;
        // but take into account the effect of crossing zero, if we did:
        if (!hasYearZero() && (parts.year > 0) != (year > 0))
            year += parts.year > 0 ? -1 : +1;
        qint64 jd;
        if (isDateValid(year, parts.month, parts.day)
            && dateToJulianDay(year, parts.month, parts.day, &jd)
            && dayOfWeek(jd) == dow) {
            return jd;
        }
        return std::nullopt;
    };
    // Empirically, aside from Gregorian, each calendar finds every dow within
    // any 29-century run, so 14 centuries is the biggest offset we ever need.
    for (int offset = 0; offset < 15; ++offset) {
        if (auto jd = checkOffset(offset))
            return *jd;
        if (offset) {
            if (auto jd = checkOffset(-offset))
                return *jd;
        }
    }
    return (std::numeric_limits<qint64>::min)();
}